

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalTypeId duckdb::TransformStringToLogicalTypeId(string *str)

{
  LogicalTypeId LVar1;
  LogicalTypeId LVar2;
  
  LVar1 = DefaultTypeGenerator::GetDefaultType(str);
  LVar2 = USER;
  if (LVar1 != INVALID) {
    LVar2 = LVar1;
  }
  return LVar2;
}

Assistant:

LogicalTypeId TransformStringToLogicalTypeId(const string &str) {
	auto type = DefaultTypeGenerator::GetDefaultType(str);
	if (type == LogicalTypeId::INVALID) {
		// This is a User Type, at this point we don't know if its one of the User Defined Types or an error
		// It is checked in the binder
		type = LogicalTypeId::USER;
	}
	return type;
}